

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O2

size_t __thiscall celero::TestVector::size(TestVector *this)

{
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
  __mutex;
  _Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_> _Var1
  ;
  long lVar2;
  long lVar3;
  
  __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  std::mutex::lock((mutex *)__mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                            _M_head_impl);
  _Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
       .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>;
  lVar2 = *(long *)((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                          _M_head_impl + 0x30);
  lVar3 = *(long *)((long)_Var1.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>.
                          _M_head_impl + 0x28);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             __mutex.super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
  return lVar2 - lVar3 >> 4;
}

Assistant:

size_t TestVector::size() const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector.size();
}